

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendTarget
               (cmXMLWriter *xml,string *target,string *make,string *makeArgs,string *path,
               char *prefix,char *makeTarget)

{
  string *psVar1;
  char *local_1d8;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  char *local_130;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *prefix_local;
  string *path_local;
  string *makeArgs_local;
  string *make_local;
  string *target_local;
  cmXMLWriter *xml_local;
  
  local_38 = prefix;
  prefix_local = (char *)path;
  path_local = makeArgs;
  makeArgs_local = make;
  make_local = target;
  target_local = (string *)xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"target",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  psVar1 = target_local;
  std::operator+(&local_90,local_38,make_local);
  cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)psVar1,"name",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)target_local,"path",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prefix_local);
  cmXMLWriter::Attribute<char[39]>
            ((cmXMLWriter *)target_local,"targetID",
             (char (*) [39])"org.eclipse.cdt.make.MakeTargetBuilder");
  psVar1 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"buildCommand",&local_b1);
  GetEclipsePath(&local_d8,makeArgs_local);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)psVar1,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  psVar1 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"buildArguments",&local_f9)
  ;
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)psVar1,&local_f8,path_local);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  psVar1 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"buildTarget",&local_121);
  if (makeTarget == (char *)0x0) {
    local_1d8 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_1d8 = makeTarget;
  }
  local_130 = local_1d8;
  cmXMLWriter::Element<char_const*>((cmXMLWriter *)psVar1,&local_120,&local_130);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  psVar1 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"stopOnError",&local_151);
  cmXMLWriter::Element<char[5]>((cmXMLWriter *)psVar1,&local_150,(char (*) [5])0xc67b47);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  psVar1 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"useDefaultCommand",&local_179);
  cmXMLWriter::Element<char[6]>((cmXMLWriter *)psVar1,&local_178,(char (*) [6])0xc2f145);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  cmXMLWriter::EndElement((cmXMLWriter *)target_local);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendTarget(
  cmXMLWriter& xml, const std::string& target, const std::string& make,
  const std::string& makeArgs, const std::string& path, const char* prefix,
  const char* makeTarget)
{
  xml.StartElement("target");
  xml.Attribute("name", prefix + target);
  xml.Attribute("path", path);
  xml.Attribute("targetID", "org.eclipse.cdt.make.MakeTargetBuilder");
  xml.Element("buildCommand",
              cmExtraEclipseCDT4Generator::GetEclipsePath(make));
  xml.Element("buildArguments", makeArgs);
  xml.Element("buildTarget", makeTarget ? makeTarget : target.c_str());
  xml.Element("stopOnError", "true");
  xml.Element("useDefaultCommand", "false");
  xml.EndElement();
}